

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void * google::protobuf::DynamicMessage::NewImpl(void *prototype,void *mem,Arena *arena)

{
  TypeInfo *type_info_00;
  uint32_t uVar1;
  TypeInfo *type_info;
  Arena *arena_local;
  void *mem_local;
  void *prototype_local;
  
  type_info_00 = *(TypeInfo **)((long)prototype + 0x10);
  uVar1 = internal::ClassData::allocation_size(&(type_info_00->class_data).super_ClassData);
  memset(mem,0,(ulong)uVar1);
  DynamicMessage((DynamicMessage *)mem,type_info_00,arena);
  return mem;
}

Assistant:

void* DynamicMessage::NewImpl(const void* prototype, void* mem, Arena* arena) {
  const auto* type_info =
      static_cast<const DynamicMessage*>(prototype)->type_info_;
  memset(mem, 0, type_info->class_data.allocation_size());
  return new (mem) DynamicMessage(type_info, arena);
}